

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Point_Object_State_PDU
          (Point_Object_State_PDU *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI,ObjectType *O,WorldCoordinates *Loc,EulerAngles *Ori,
          PointObjectAppearance *P,SimulationIdentifier *ReqID,SimulationIdentifier *RecvID)

{
  KFLOAT64 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KFLOAT32 KVar5;
  KUINT16 KVar6;
  
  Object_State_Header::Object_State_Header
            (&this->super_Object_State_Header,ObjID,RefObjID,UpdateNum,FI);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Point_Object_State_PDU_00222cc0;
  (this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__ObjectType_00224cc8;
  KVar2 = O->m_ui8EntityKind;
  KVar3 = O->m_ui8Category;
  KVar4 = O->m_ui8SubCategory;
  (this->m_ObjTyp).m_ui8Domain = O->m_ui8Domain;
  (this->m_ObjTyp).m_ui8EntityKind = KVar2;
  (this->m_ObjTyp).m_ui8Category = KVar3;
  (this->m_ObjTyp).m_ui8SubCategory = KVar4;
  (this->m_Loc).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00223b28;
  KVar1 = Loc->m_f64Y;
  (this->m_Loc).m_f64X = Loc->m_f64X;
  (this->m_Loc).m_f64Y = KVar1;
  (this->m_Loc).m_f64Z = Loc->m_f64Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_002235b0;
  KVar5 = Ori->m_f32Theta;
  (this->m_Ori).m_f32Psi = Ori->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar5;
  (this->m_Ori).m_f32Phi = Ori->m_f32Phi;
  (this->m_Apperance).super_ObjectAppearance.m_GeneralAppearanceUnion =
       (P->super_ObjectAppearance).m_GeneralAppearanceUnion;
  (this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__PointObjectAppearance_00224dd0;
  *(undefined4 *)&(this->m_Apperance).super_ObjectAppearance.field_0xc =
       *(undefined4 *)&(P->super_ObjectAppearance).field_0xc;
  this->m_ui16Padding = 0;
  (this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar6 = ReqID->m_ui16ApplicationID;
  (this->m_ReqID).m_ui16SiteID = ReqID->m_ui16SiteID;
  (this->m_ReqID).m_ui16ApplicationID = KVar6;
  (this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar6 = RecvID->m_ui16ApplicationID;
  (this->m_RecvID).m_ui16SiteID = RecvID->m_ui16SiteID;
  (this->m_RecvID).m_ui16ApplicationID = KVar6;
  this->m_ui32Padding1 = 0;
  (this->super_Object_State_Header).field_0x4b = 0;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = '+';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x58;
  return;
}

Assistant:

Point_Object_State_PDU::Point_Object_State_PDU( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID , KUINT16 UpdateNum,
        ForceID FI, const ObjectType & O, const WorldCoordinates & Loc, const EulerAngles & Ori,
        const PointObjectAppearance & P, const SimulationIdentifier & ReqID,
        const SimulationIdentifier & RecvID ) :
    Object_State_Header( ObjID, RefObjID, UpdateNum, FI ),
    m_ObjTyp( O ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_Apperance( P ),
    m_ui16Padding( 0 ),
    m_ui32Padding1( 0 ),
    m_ReqID( ReqID ),
    m_RecvID( RecvID )
{
    m_ModificationUnion.m_ui8Modifications = 0;
    m_ui8PDUType = PointObjectState_PDU_Type;
    m_ui16PDULength = POINT_OBJECT_STATE_PDU_SIZE;
}